

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.h
# Opt level: O1

Type * __thiscall
google::protobuf::util::converter::ProtoWriter::LookupType(ProtoWriter *this,Field *field)

{
  TypeInfo *pTVar1;
  string *psVar2;
  pointer pcVar3;
  size_t size;
  int iVar4;
  undefined4 extraout_var;
  
  if ((field->kind_ & 0xfffffffeU) == 10) {
    pTVar1 = this->typeinfo_;
    psVar2 = (field->type_url_).ptr_;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    size = psVar2->_M_string_length;
    if ((long)size < 0) {
      StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
    }
    iVar4 = (*pTVar1->_vptr_TypeInfo[3])(pTVar1,pcVar3,size);
    return (Type *)CONCAT44(extraout_var,iVar4);
  }
  return ((this->element_)._M_t.
          super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
          .
          super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
         ._M_head_impl)->type_;
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::Field_Kind Field::_internal_kind() const {
  return static_cast< PROTOBUF_NAMESPACE_ID::Field_Kind >(kind_);
}